

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O3

wchar_t calc_blows(player *p,object *obj,player_state_conflict *state,wchar_t extra_blows)

{
  player_class *ppVar1;
  int16_t iVar2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  
  if (obj == (object *)0x0) {
    wVar5 = L'\0';
  }
  else {
    iVar2 = object_weight_one(obj);
    wVar5 = (wchar_t)iVar2;
  }
  ppVar1 = p->class;
  wVar6 = ppVar1->min_weight;
  if (ppVar1->min_weight < wVar5) {
    wVar6 = wVar5;
  }
  iVar3 = (ppVar1->att_multiply * adj_str_blow[state->stat_ind[0]]) / wVar6;
  iVar4 = 0xb;
  if (iVar3 < 0xb) {
    iVar4 = iVar3;
  }
  iVar3 = ppVar1->max_attacks * 100;
  iVar4 = (int)(10000 / (long)blows_table[iVar4][adj_dex_blow[state->stat_ind[3]]]);
  if (iVar3 <= iVar4) {
    iVar4 = iVar3;
  }
  wVar5 = iVar4 + extra_blows * 100;
  wVar6 = L'd';
  if ((p->opts).opt[0x2c] != false) {
    wVar6 = L'È';
  }
  if (wVar5 <= wVar6) {
    wVar5 = wVar6;
  }
  return wVar5;
}

Assistant:

int calc_blows(struct player *p, const struct object *obj,
			   struct player_state *state, int extra_blows)
{
	int blows;
	int str_index, dex_index;
	int div;
	int blow_energy;

	int weight = (obj == NULL) ? 0 : object_weight_one(obj);
	int min_weight = p->class->min_weight;

	/* Enforce a minimum "weight" (tenth pounds) */
	div = (weight < min_weight) ? min_weight : weight;

	/* Get the strength vs weight */
	str_index = adj_str_blow[state->stat_ind[STAT_STR]] *
			p->class->att_multiply / div;

	/* Maximal value */
	if (str_index > 11) str_index = 11;

	/* Index by dexterity */
	dex_index = MIN(adj_dex_blow[state->stat_ind[STAT_DEX]], 11);

	/* Use the blows table to get energy per blow */
	blow_energy = blows_table[str_index][dex_index];

	blows = MIN((10000 / blow_energy), (100 * p->class->max_attacks));

	/* Require at least one blow, two for O-combat */
	return MAX(blows + (100 * extra_blows),
			   OPT(p, birth_percent_damage) ? 200 : 100);
}